

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_async_notification_event_init(ma_async_notification_event *pNotificationEvent)

{
  if (pNotificationEvent != (ma_async_notification_event *)0x0) {
    (pNotificationEvent->cb).onSignal = ma_async_notification_event__on_signal;
    return MA_NOT_IMPLEMENTED;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_async_notification_event_init(ma_async_notification_event* pNotificationEvent)
{
    if (pNotificationEvent == NULL) {
        return MA_INVALID_ARGS;
    }

    pNotificationEvent->cb.onSignal = ma_async_notification_event__on_signal;

    #ifndef MA_NO_THREADING
    {
        ma_result result;

        result = ma_event_init(&pNotificationEvent->e);
        if (result != MA_SUCCESS) {
            return result;
        }

        return MA_SUCCESS;
    }
    #else
    {
        return MA_NOT_IMPLEMENTED;  /* Threading is disabled. */
    }
    #endif
}